

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O0

ostream * operator<<(ostream *outputStream,Itemset *itemset)

{
  element_type *arr;
  ostream *poVar1;
  Itemset *itemset_local;
  ostream *outputStream_local;
  
  std::operator<<(outputStream,"ITEM: ");
  arr = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                  ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)itemset);
  operator<<(outputStream,arr);
  poVar1 = std::operator<<(outputStream,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,itemset->theSupport);
  std::operator<<(poVar1,")");
  std::operator<<(outputStream,"\n");
  return outputStream;
}

Assistant:

ostream &operator<<(ostream &outputStream, Itemset &itemset) {
    outputStream << "ITEM: ";
    outputStream << *itemset.theItemset;
    outputStream << "(" << itemset.theSupport << ")";
    outputStream << "\n";
    return outputStream;
}